

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::CordInputStream::ReadCord(CordInputStream *this,Cord *cord,int count)

{
  char **ppcVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  Cord local_40;
  
  uVar2 = (this->it_).chunk_iterator_.bytes_remaining_;
  uVar5 = this->size_ - this->available_;
  if (uVar5 <= uVar2) {
    uVar4 = (this->it_).chunk_iterator_.current_chunk_._M_len;
    sVar6 = uVar4 - uVar5;
    if (uVar4 < uVar5 || sVar6 == 0) {
      if (this->size_ != this->available_) {
        lVar3 = (long)(this->it_).chunk_iterator_.btree_reader_.navigator_.height_;
        if ((lVar3 < 0) ||
           ((this->it_).chunk_iterator_.btree_reader_.navigator_.node_[lVar3] == (CordRepBtree *)0x0
           )) {
          (this->it_).chunk_iterator_.bytes_remaining_ = 0;
        }
        else {
          absl::lts_20240722::Cord::ChunkIterator::AdvanceBytesBtree
                    (&(this->it_).chunk_iterator_,uVar5);
        }
      }
    }
    else {
      ppcVar1 = &(this->it_).chunk_iterator_.current_chunk_._M_str;
      *ppcVar1 = *ppcVar1 + uVar5;
      (this->it_).chunk_iterator_.current_chunk_._M_len = sVar6;
      (this->it_).chunk_iterator_.bytes_remaining_ = uVar2 - uVar5;
    }
    uVar4 = (ulong)count;
    uVar2 = this->bytes_remaining_;
    uVar5 = uVar4;
    if (uVar2 < uVar4) {
      uVar5 = uVar2;
    }
    absl::lts_20240722::Cord::ChunkIterator::AdvanceAndReadBytes((ulong)&local_40);
    absl::lts_20240722::Cord::Append(cord);
    absl::lts_20240722::Cord::~Cord(&local_40);
    this->bytes_remaining_ = this->bytes_remaining_ - uVar5;
    LoadChunkData(this);
    return uVar4 <= uVar2;
  }
  __assert_fail("bytes_remaining_ >= n",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                ,0x647,"void absl::Cord::ChunkIterator::AdvanceBytes(size_t)");
}

Assistant:

bool CordInputStream::ReadCord(absl::Cord* cord, int count) {
  // Advance the iterator to the current position
  const size_t used = size_ - available_;
  absl::Cord::Advance(&it_, used);

  // Read the cord, adjusting the iterator position.
  // Make sure to cap at available bytes to avoid hard crashes.
  const size_t n = std::min(static_cast<size_t>(count), bytes_remaining_);
  cord->Append(absl::Cord::AdvanceAndRead(&it_, n));

  // Update current chunk data.
  bytes_remaining_ -= n;
  LoadChunkData();

  return n == static_cast<size_t>(count);
}